

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall GlobOpt::OptNewScObject(GlobOpt *this,Instr **instrPtr,Value *srcVal)

{
  OpCode OVar1;
  Func *this_00;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  ProfiledInstr *pPVar4;
  undefined4 *puVar5;
  JITTimeConstructorCache *local_50;
  JITTimeConstructorCache *ctorCache;
  bool isCtorInlined;
  Instr **instr;
  Value *srcVal_local;
  Instr **instrPtr_local;
  GlobOpt *this_local;
  
  bVar3 = IR::Instr::IsNewScObjectInstr(*instrPtr);
  if (((bVar3) && (bVar3 = IsLoopPrePass(this), !bVar3)) && (bVar3 = DoFieldRefOpts(this), bVar3)) {
    sourceContextId = Func::GetSourceContextId(this->func);
    functionId = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,ObjTypeSpecNewObjPhase,sourceContextId,functionId);
    if (!bVar3) {
      OVar1 = (*instrPtr)->m_opcode;
      bVar3 = IR::Instr::IsProfiledInstr(*instrPtr);
      if (bVar3) {
        this_00 = (*instrPtr)->m_func;
        pPVar4 = IR::Instr::AsProfiledInstr(*instrPtr);
        local_50 = Func::GetConstructorCache(this_00,(pPVar4->u).field_3.fldInfoData.f1);
      }
      else {
        local_50 = (JITTimeConstructorCache *)0x0;
      }
      if (((local_50 != (JITTimeConstructorCache *)0x0) &&
          (bVar3 = JITTimeConstructorCache::IsTypeFinal(local_50), bVar3)) &&
         (bVar3 = JITTimeConstructorCache::CtorHasNoExplicitReturnValue(local_50), !bVar3)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                           ,0x669,
                           "(ctorCache == nullptr || !ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue())"
                           ,
                           "ctorCache == nullptr || !ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue()"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (((local_50 != (JITTimeConstructorCache *)0x0) &&
          (bVar3 = JITTimeConstructorCache::SkipNewScObject(local_50), !bVar3)) &&
         ((OVar1 == NewScObjectNoCtor ||
          (bVar3 = JITTimeConstructorCache::IsTypeFinal(local_50), bVar3)))) {
        GenerateBailAtOperation(this,instrPtr,BailOutFailedCtorGuardCheck);
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::OptNewScObject(IR::Instr** instrPtr, Value* srcVal)
{
    IR::Instr *&instr = *instrPtr;

    if (!instr->IsNewScObjectInstr() || IsLoopPrePass() || !this->DoFieldRefOpts() || PHASE_OFF(Js::ObjTypeSpecNewObjPhase, this->func))
    {
        return;
    }

    bool isCtorInlined = instr->m_opcode == Js::OpCode::NewScObjectNoCtor;
    const JITTimeConstructorCache * ctorCache = instr->IsProfiledInstr() ?
        instr->m_func->GetConstructorCache(static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId)) : nullptr;

    // TODO: OOP JIT, enable assert
    //Assert(ctorCache == nullptr || srcVal->GetValueInfo()->IsVarConstant() && Js::VarIs<Js::JavascriptFunction>(srcVal->GetValueInfo()->AsVarConstant()->VarValue()));
    Assert(ctorCache == nullptr || !ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue());

    if (ctorCache != nullptr && !ctorCache->SkipNewScObject() && (isCtorInlined || ctorCache->IsTypeFinal()))
    {
        GenerateBailAtOperation(instrPtr, IR::BailOutFailedCtorGuardCheck);
    }
}